

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O0

void __thiscall Arbitraryint::~Arbitraryint(Arbitraryint *this)

{
  Arbitraryint *this_local;
  
  ~Arbitraryint(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

DEF_TEST(int, Arbitrary)
{
  testinator::Arbitrary<int> a;
  int v = a.generate(0,0);
  a.shrink(v);
  return true;
}